

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cc
# Opt level: O0

void raptor::LogInit(void)

{
  LogSetLevel(kLogLevelDebug);
  (anonymous_namespace)::g_level_string._0_1_ = 0x44;
  (anonymous_namespace)::g_level_string._1_1_ = 0x49;
  (anonymous_namespace)::g_level_string._2_1_ = 0x45;
  return;
}

Assistant:

void LogInit(void) {
#ifndef NDEBUG
    LogSetLevel(LogLevel::kLogLevelDebug);
#else
    LogSetLevel(LogLevel::kLogLevelError);
#endif
    g_level_string[static_cast<int>(LogLevel::kLogLevelDebug)] = 'D';
    g_level_string[static_cast<int>(LogLevel::kLogLevelInfo)] = 'I';
    g_level_string[static_cast<int>(LogLevel::kLogLevelError)] = 'E';
}